

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnRefFunc(SharedValidator *this,Location *loc,Var *func_var)

{
  bool bVar1;
  Index func_type_00;
  Result rhs;
  char *pcVar2;
  int __c;
  int __c_00;
  int extraout_EDX;
  Var *__x;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar3;
  Index func_type;
  undefined1 local_80 [80];
  Enum local_30;
  Opcode local_2c;
  Var *local_28;
  Var *func_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  local_28 = func_var;
  func_var_local = (Var *)loc;
  loc_local = (Location *)this;
  Opcode::Opcode(&local_2c,RefFunc);
  this_local._4_4_ = CheckInstr(this,local_2c,&func_var_local->loc);
  Var::Var((Var *)(local_80 + 8),func_var);
  local_30 = (Enum)CheckFuncIndex(this,(Var *)(local_80 + 8),(FuncType *)0x0);
  pcVar2 = (char *)(ulong)local_30;
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_30);
  Var::~Var((Var *)(local_80 + 8));
  local_80._4_4_ = this_local._4_4_;
  bVar1 = Succeeded(this_local._4_4_);
  if (bVar1) {
    if ((this->in_init_expr_ & 1U) == 0) {
      __x = func_var;
      std::vector<wabt::Var,_std::allocator<wabt::Var>_>::push_back
                (&this->check_declared_funcs_,func_var);
      __c_00 = extraout_EDX;
    }
    else {
      pcVar2 = Var::index(func_var,pcVar2,__c);
      local_80._0_4_ = SUB84(pcVar2,0);
      __x = (Var *)local_80;
      pVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                        (&this->declared_funcs_,(value_type_conflict2 *)__x);
      __c_00 = pVar3._8_4_;
    }
    pcVar2 = Var::index(func_var,(char *)__x,__c_00);
    func_type_00 = GetFunctionTypeIndex(this,(Index)pcVar2);
    rhs = TypeChecker::OnRefFuncExpr
                    (&this->typechecker_,func_type_00,(bool)(this->in_init_expr_ & 1));
    Result::operator|=((Result *)((long)&this_local + 4),rhs);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnRefFunc(const Location& loc, Var func_var) {
  Result result = CheckInstr(Opcode::RefFunc, loc);
  result |= CheckFuncIndex(func_var);
  if (Succeeded(result)) {
    // References in initializer expressions are considered declarations, as
    // opposed to references in function bodies that are considered usages.
    if (in_init_expr_) {
      declared_funcs_.insert(func_var.index());
    } else {
      check_declared_funcs_.push_back(func_var);
    }
    Index func_type = GetFunctionTypeIndex(func_var.index());
    result |= typechecker_.OnRefFuncExpr(func_type, in_init_expr_);
  }
  return result;
}